

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  pointer puVar2;
  ElementSegment *segment_00;
  char cVar3;
  HeapType type;
  Module *pMVar4;
  ulong uVar5;
  pointer puVar6;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar7;
  undefined1 local_60 [8];
  Literal null;
  TableInterfaceInfo info;
  
  pMVar4 = this->wasm;
  puVar6 = (pMVar4->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pMVar4->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      cVar3 = wasm::Type::isNullable();
      if (cVar3 != '\0') {
        getTableInterfaceInfo
                  ((TableInterfaceInfo *)&null.type,this,
                   (IString)*(IString *)
                             &(((puVar6->_M_t).
                                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                              super_Importable).super_Named);
        type.id = wasm::Type::getHeapType();
        Literal::makeNull((Literal *)local_60,type);
        if ((((puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr != 0) {
          uVar5 = 0;
          do {
            (**(code **)(*(long *)null.type.id + 0xe0))
                      (null.type.id,info.interface,info.name.super_IString.str._M_len,
                       uVar5 & 0xffffffff,(Literal *)local_60);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (((puVar6->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).
                           addr);
        }
        wasm::Literal::~Literal((Literal *)local_60);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    pMVar4 = this->wasm;
  }
  puVar7 = (pMVar4->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pMVar4->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    null.type.id = (uintptr_t)this;
    do {
      segment_00 = (puVar7->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(long *)(segment_00 + 0x20) != 0) {
        initializeTableContents::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&null.type,segment_00);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInterfaceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface->tableStore(info.name, i, null);
        }
      }
    }

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Address offset =
        (uint32_t)self()->visit(segment->offset).getSingleValue().geti32();

      Table* table = wasm.getTable(segment->table);
      ExternalInterface* extInterface = externalInterface;
      Name tableName = segment->table;
      if (table->imported()) {
        auto inst = linkedInstances.at(table->module);
        extInterface = inst->externalInterface;
        tableName = inst->wasm.getExport(table->base)->value;
      }

      for (Index i = 0; i < segment->data.size(); ++i) {
        Flow ret = self()->visit(segment->data[i]);
        extInterface->tableStore(tableName, offset + i, ret.getSingleValue());
      }
    });
  }